

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

FuncNode * __thiscall asmjit::BaseCompiler::addFunc(BaseCompiler *this,FuncNode *func)

{
  int iVar1;
  BaseNode *pBVar2;
  anon_union_8_2_effa25e6_for_BaseNode_9 aVar3;
  char *pcVar4;
  Error EVar5;
  undefined4 extraout_var;
  ulong extraout_RAX;
  uint8_t uVar6;
  int *in_RCX;
  int *extraout_RDX;
  int unaff_EBX;
  uint uVar7;
  BaseCompiler *unaff_R13;
  BaseNode *unaff_R14;
  FuncNode *pFStack_58;
  size_t sStack_50;
  
  if (this->_func == (FuncNode *)0x0) {
    this->_func = func;
    BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func);
    pBVar2 = (this->super_BaseBuilder)._cursor;
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_exitNode->super_BaseNode);
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_end->super_BaseNode);
    (this->super_BaseBuilder)._cursor = pBVar2;
    return func;
  }
  addFunc();
  iVar1 = *extraout_RDX;
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    _newRetNode();
LAB_0011559a:
    EVar5 = BaseEmitter::reportError((BaseEmitter *)unaff_R13,1,(char *)0x0);
    if (EVar5 != 0) {
      return (FuncNode *)CONCAT44(extraout_var,EVar5);
    }
    uVar7 = (uint)DAT_00000013;
    uVar6 = '\x02';
    if (unaff_EBX == 0) {
      uVar6 = iVar1 != 0;
    }
    (unaff_R14->field_1)._any._reserved0 = uVar6;
    if (uVar7 == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/core/../core/../core/builder.h"
                 ,0x33e,"index < opCapacity()");
    }
    _newRetNode();
    if ((extraout_RAX & 1) == 0) goto LAB_0011557c;
  }
  else {
    unaff_EBX = *in_RCX;
    unaff_R14 = (BaseNode *)
                ZoneAllocator::_alloc(&(this->super_BaseBuilder)._allocator,0x80,&sStack_50);
    unaff_R13 = this;
    pFStack_58 = func;
    if (unaff_R14 == (BaseNode *)0x0) goto LAB_0011559a;
    (unaff_R14->field_0).field_0._prev = (BaseNode *)0x0;
    (unaff_R14->field_0).field_0._next = (BaseNode *)0x0;
    (unaff_R14->field_1)._any._nodeType = '\x01';
    (unaff_R14->field_1)._any._nodeFlags = (byte)(this->super_BaseBuilder)._nodeFlags | 0x29;
    *(undefined8 *)&unaff_R14->_position = 0;
    *(undefined8 *)((long)&unaff_R14->field_3 + 4) = 0;
    unaff_R14->_passData = (void *)0x0;
    unaff_R14->_inlineComment = (char *)0x0;
    unaff_R14[1].field_0.field_0._prev = (BaseNode *)0x80000000;
    unaff_R14[1].field_0.field_0._next = (BaseNode *)0x0;
    (unaff_R14->field_1)._any._reserved1 = '\x04';
    (unaff_R14->field_1)._any._nodeType = '\x11';
    uVar6 = '\x02';
    if (unaff_EBX == 0) {
      uVar6 = iVar1 != 0;
    }
    (unaff_R14->field_1)._any._reserved0 = uVar6;
    iVar1 = extraout_RDX[1];
    aVar3 = *(anon_union_8_2_effa25e6_for_BaseNode_9 *)(extraout_RDX + 2);
    unaff_R14[1].field_1 = (anon_union_4_4_9308554c_for_BaseNode_2)extraout_RDX[0];
    unaff_R14[1]._position = iVar1;
    unaff_R14[1].field_3 = aVar3;
    pcVar4 = *(char **)(in_RCX + 2);
    unaff_R14[1]._passData = *(void **)in_RCX;
    unaff_R14[1]._inlineComment = pcVar4;
    uVar7 = 4;
  }
  memset(unaff_R14 + 2,0,((ulong)(uVar7 << 4) + 0xfffffffd0 & 0xffffffff0) + 0x10);
LAB_0011557c:
  (pFStack_58->super_LabelNode).super_BaseNode.field_0.field_0._prev = unaff_R14;
  return (FuncNode *)0x0;
}

Assistant:

FuncNode* BaseCompiler::addFunc(FuncNode* func) {
  ASMJIT_ASSERT(_func == nullptr);
  _func = func;

  addNode(func);                 // Function node.
  BaseNode* prev = cursor();     // {CURSOR}.
  addNode(func->exitNode());     // Function exit label.
  addNode(func->endNode());      // Function end sentinel.

  _setCursor(prev);
  return func;
}